

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O0

double __thiscall
HighsPseudocost::getScore(HighsPseudocost *this,HighsInt col,double upcost,double downcost)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double *pdVar6;
  const_reference pvVar7;
  const_reference pvVar8;
  size_type sVar9;
  int in_ESI;
  long in_RDI;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  anon_class_1_0_00000001 mapScore;
  double conflictScore;
  double conflictScoreAvg;
  double conflictScoreDown;
  double conflictScoreUp;
  double cutoffScore;
  double avgCutoffs;
  double cutOffScoreDown;
  double cutOffScoreUp;
  double inferenceScore;
  double costScore;
  anon_class_1_0_00000001 local_121;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  int local_c;
  
  local_30 = 1e-06;
  local_c = in_ESI;
  pdVar6 = std::max<double>(&local_18,&local_30);
  dVar1 = *pdVar6;
  local_38 = 1e-06;
  pdVar6 = std::max<double>(&local_20,&local_38);
  dVar2 = *pdVar6;
  local_40 = 1e-06;
  local_48 = *(double *)(in_RDI + 0x130) * *(double *)(in_RDI + 0x130);
  pdVar6 = std::max<double>(&local_40,&local_48);
  local_28 = (dVar1 * dVar2) / *pdVar6;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),(long)local_c);
  local_58 = 1e-06;
  pdVar6 = std::max<double>(pvVar7,&local_58);
  dVar1 = *pdVar6;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x78),(long)local_c);
  local_60 = 1e-06;
  pdVar6 = std::max<double>(pvVar7,&local_60);
  dVar2 = *pdVar6;
  local_68 = 1e-06;
  local_70 = *(double *)(in_RDI + 0x138) * *(double *)(in_RDI + 0x138);
  pdVar6 = std::max<double>(&local_68,&local_70);
  local_50 = (dVar1 * dVar2) / *pdVar6;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)local_c);
  iVar3 = *pvVar8;
  local_80 = 1.0;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)local_c);
  iVar4 = *pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x30),(long)local_c);
  local_88 = (double)iVar4 + (double)*pvVar8;
  pdVar6 = std::max<double>(&local_80,&local_88);
  local_78 = (double)iVar3 / *pdVar6;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd8),(long)local_c);
  iVar3 = *pvVar8;
  local_98 = 1.0;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd8),(long)local_c);
  iVar4 = *pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48),(long)local_c);
  local_a0 = (double)iVar4 + (double)*pvVar8;
  pdVar6 = std::max<double>(&local_98,&local_a0);
  local_90 = (double)iVar3 / *pdVar6;
  lVar5 = *(long *)(in_RDI + 0x150);
  local_b0 = 1.0;
  local_b8 = (double)*(long *)(in_RDI + 0x150) + (double)*(long *)(in_RDI + 0x140);
  pdVar6 = std::max<double>(&local_b0,&local_b8);
  local_a8 = (double)lVar5 / *pdVar6;
  local_c8 = 1e-06;
  pdVar6 = std::max<double>(&local_78,&local_c8);
  dVar1 = *pdVar6;
  local_d0 = 1e-06;
  pdVar6 = std::max<double>(&local_90,&local_d0);
  dVar2 = *pdVar6;
  local_d8 = 1e-06;
  local_e0 = local_a8 * local_a8;
  pdVar6 = std::max<double>(&local_d8,&local_e0);
  local_c0 = (dVar1 * dVar2) / *pdVar6;
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf0),(long)local_c);
  local_e8 = *pvVar7 / *(double *)(in_RDI + 0x120);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x108),(long)local_c);
  local_f0 = *pvVar7 / *(double *)(in_RDI + 0x120);
  dVar1 = *(double *)(in_RDI + 0x120);
  dVar2 = *(double *)(in_RDI + 0x128);
  sVar9 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xf0));
  auVar14._8_4_ = (int)(sVar9 >> 0x20);
  auVar14._0_8_ = sVar9;
  auVar14._12_4_ = 0x45300000;
  local_f8 = dVar2 / (dVar1 * ((auVar14._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar9) - 4503599627370496.0)));
  local_108 = 1e-06;
  pdVar6 = std::max<double>(&local_e8,&local_108);
  dVar1 = *pdVar6;
  local_110 = 1e-06;
  pdVar6 = std::max<double>(&local_f0,&local_110);
  dVar2 = *pdVar6;
  local_118 = 1e-06;
  local_120 = local_f8 * local_f8;
  pdVar6 = std::max<double>(&local_118,&local_120);
  local_100 = (dVar1 * dVar2) / *pdVar6;
  dVar10 = getScore::anon_class_1_0_00000001::operator()(&local_121,local_28);
  dVar1 = *(double *)(in_RDI + 0x160);
  dVar2 = *(double *)(in_RDI + 0x160);
  dVar11 = getScore::anon_class_1_0_00000001::operator()(&local_121,local_100);
  dVar12 = getScore::anon_class_1_0_00000001::operator()(&local_121,local_c0);
  dVar13 = getScore::anon_class_1_0_00000001::operator()(&local_121,local_50);
  return dVar2 * (dVar11 * 0.01 + (dVar12 + dVar13) * 0.0001) + dVar10 / dVar1;
}

Assistant:

double getScore(HighsInt col, double upcost, double downcost) const {
    double costScore = std::max(upcost, 1e-6) * std::max(downcost, 1e-6) /
                       std::max(1e-6, cost_total * cost_total);
    double inferenceScore = std::max(inferencesup[col], 1e-6) *
                            std::max(inferencesdown[col], 1e-6) /
                            std::max(1e-6, inferences_total * inferences_total);

    double cutOffScoreUp =
        ncutoffsup[col] /
        std::max(1.0, static_cast<double>(ncutoffsup[col]) +
                          static_cast<double>(nsamplesup[col]));
    double cutOffScoreDown =
        ncutoffsdown[col] /
        std::max(1.0, static_cast<double>(ncutoffsdown[col]) +
                          static_cast<double>(nsamplesdown[col]));
    double avgCutoffs = static_cast<double>(ncutoffstotal) /
                        std::max(1.0, static_cast<double>(ncutoffstotal) +
                                          static_cast<double>(nsamplestotal));

    double cutoffScore = std::max(cutOffScoreUp, 1e-6) *
                         std::max(cutOffScoreDown, 1e-6) /
                         std::max(1e-6, avgCutoffs * avgCutoffs);

    double conflictScoreUp = conflictscoreup[col] / conflict_weight;
    double conflictScoreDown = conflictscoredown[col] / conflict_weight;
    double conflictScoreAvg =
        conflict_avg_score /
        (conflict_weight * static_cast<double>(conflictscoreup.size()));
    double conflictScore = std::max(conflictScoreUp, 1e-6) *
                           std::max(conflictScoreDown, 1e-6) /
                           std::max(1e-6, conflictScoreAvg * conflictScoreAvg);

    auto mapScore = [](double score) { return 1.0 - 1.0 / (1.0 + score); };
    return mapScore(costScore) / degeneracyFactor +
           degeneracyFactor *
               (1e-2 * mapScore(conflictScore) +
                1e-4 * (mapScore(cutoffScore) + mapScore(inferenceScore)));
  }